

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptorProto::InternalSwap
          (FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  int32 iVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  FieldOptions *pFVar5;
  void *pvVar6;
  UnknownFieldSet *other_00;
  
  psVar4 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar4;
  psVar4 = (this->extendee_).ptr_;
  (this->extendee_).ptr_ = (other->extendee_).ptr_;
  (other->extendee_).ptr_ = psVar4;
  psVar4 = (this->type_name_).ptr_;
  (this->type_name_).ptr_ = (other->type_name_).ptr_;
  (other->type_name_).ptr_ = psVar4;
  psVar4 = (this->default_value_).ptr_;
  (this->default_value_).ptr_ = (other->default_value_).ptr_;
  (other->default_value_).ptr_ = psVar4;
  psVar4 = (this->json_name_).ptr_;
  (this->json_name_).ptr_ = (other->json_name_).ptr_;
  (other->json_name_).ptr_ = psVar4;
  pFVar5 = this->options_;
  this->options_ = other->options_;
  other->options_ = pFVar5;
  iVar1 = this->number_;
  this->number_ = other->number_;
  other->number_ = iVar1;
  iVar1 = this->oneof_index_;
  this->oneof_index_ = other->oneof_index_;
  other->oneof_index_ = iVar1;
  iVar2 = this->label_;
  this->label_ = other->label_;
  other->label_ = iVar2;
  iVar2 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar2;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar6 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar6 & 1) == 0) goto LAB_002fbcbb;
LAB_002fbcae:
    other_00 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar6 & 1) != 0) goto LAB_002fbcae;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002fbcbb:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void FieldDescriptorProto::InternalSwap(FieldDescriptorProto* other) {
  name_.Swap(&other->name_);
  extendee_.Swap(&other->extendee_);
  type_name_.Swap(&other->type_name_);
  default_value_.Swap(&other->default_value_);
  json_name_.Swap(&other->json_name_);
  std::swap(options_, other->options_);
  std::swap(number_, other->number_);
  std::swap(oneof_index_, other->oneof_index_);
  std::swap(label_, other->label_);
  std::swap(type_, other->type_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}